

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_DestroyEmptyDir::_Run(_Test_DestroyEmptyDir *this)

{
  int iVar1;
  long *plVar2;
  pointer pbVar3;
  TestEnv env;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  string dbname;
  Options opts;
  undefined1 local_288 [16];
  Env *local_278;
  undefined1 local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  undefined1 local_248 [36];
  int local_224;
  void *local_220;
  Tester local_218;
  Options local_78;
  
  test::TmpDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append(&local_218.ok_);
  pbVar3 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pbVar3) {
    local_248._16_8_ = (pbVar3->_M_dataplus)._M_p;
    local_248._24_8_ = plVar2[3];
    local_248._0_8_ = (pointer)(local_248 + 0x10);
  }
  else {
    local_248._16_8_ = (pbVar3->_M_dataplus)._M_p;
    local_248._0_8_ = (pointer)*plVar2;
  }
  local_248._8_8_ = plVar2[1];
  *plVar2 = (long)pbVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((int *)CONCAT71(local_218._1_7_,local_218.ok_) != &local_218.line_) {
    operator_delete((undefined1 *)CONCAT71(local_218._1_7_,local_218.ok_));
  }
  local_278 = Env::Default();
  local_288._8_8_ = &PTR__EnvWrapper_0015bbf8;
  local_270 = 0;
  (*local_278->_vptr_Env[10])(&local_220,local_278,local_248);
  if (local_220 != (void *)0x0) {
    operator_delete__(local_220);
  }
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x67c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  iVar1 = (*local_278->_vptr_Env[6])(local_278,local_248);
  test::Tester::Is(&local_218,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_218);
  Options::Options(&local_78);
  local_78.env = (Env *)(local_288 + 8);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x681;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  (*local_278->_vptr_Env[9])(&local_268,local_278,local_248);
  test::Tester::IsOk(&local_218,(Status *)&local_268);
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete__(local_268.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x682;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  iVar1 = (*local_278->_vptr_Env[6])(local_278,local_248);
  test::Tester::Is(&local_218,SUB41(iVar1,0),"env.FileExists(dbname)");
  test::Tester::~Tester(&local_218);
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x684;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  TestEnv::GetChildren
            ((TestEnv *)local_288,(string *)(local_288 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_248);
  test::Tester::IsOk(&local_218,(Status *)local_288);
  if ((_func_int **)local_288._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_288._0_8_);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x686;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  local_224 = 2;
  local_288._0_8_ =
       (long)local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  test::Tester::IsEq<int,unsigned_long>(&local_218,&local_224,(unsigned_long *)local_288);
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x687;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  DestroyDB((leveldb *)local_288,(string *)local_248,&local_78);
  test::Tester::IsOk(&local_218,(Status *)local_288);
  if ((_func_int **)local_288._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_288._0_8_);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x688;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  iVar1 = (*local_278->_vptr_Env[6])(local_278,local_248);
  test::Tester::Is(&local_218,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_218);
  local_270 = 1;
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x68c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  (*local_278->_vptr_Env[9])(local_288,local_278,local_248);
  test::Tester::IsOk(&local_218,(Status *)local_288);
  if ((_func_int **)local_288._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_288._0_8_);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x68d;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  iVar1 = (*local_278->_vptr_Env[6])(local_278,local_248);
  test::Tester::Is(&local_218,SUB41(iVar1,0),"env.FileExists(dbname)");
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x68e;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  TestEnv::GetChildren
            ((TestEnv *)local_288,(string *)(local_288 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_248);
  test::Tester::IsOk(&local_218,(Status *)local_288);
  if ((_func_int **)local_288._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_288._0_8_);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x68f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  local_224 = 0;
  local_288._0_8_ =
       (long)local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  test::Tester::IsEq<int,unsigned_long>(&local_218,&local_224,(unsigned_long *)local_288);
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x690;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  DestroyDB((leveldb *)local_288,(string *)local_248,&local_78);
  test::Tester::IsOk(&local_218,(Status *)local_288);
  if ((_func_int **)local_288._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_288._0_8_);
  }
  test::Tester::~Tester(&local_218);
  local_218.ok_ = true;
  local_218.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_218.line_ = 0x691;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_218.ss_);
  iVar1 = (*local_278->_vptr_Env[6])(local_278,local_248);
  test::Tester::Is(&local_218,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  EnvWrapper::~EnvWrapper((EnvWrapper *)(local_288 + 8));
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_);
  }
  return;
}

Assistant:

TEST(DBTest, DestroyEmptyDir) {
  std::string dbname = test::TmpDir() + "/db_empty_dir";
  TestEnv env(Env::Default());
  env.DeleteDir(dbname);
  ASSERT_TRUE(!env.FileExists(dbname));

  Options opts;
  opts.env = &env;

  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  std::vector<std::string> children;
  ASSERT_OK(env.GetChildren(dbname, &children));
  // The stock Env's do not filter out '.' and '..' special files.
  ASSERT_EQ(2, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));

  // Should also be destroyed if Env is filtering out dot files.
  env.SetIgnoreDotFiles(true);
  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  ASSERT_OK(env.GetChildren(dbname, &children));
  ASSERT_EQ(0, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));
}